

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O1

void __thiscall
glslang::TParseVersions::extensionRequires
          (TParseVersions *this,TSourceLoc *loc,char *extension,char *behaviorString)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  ulong uVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> ext;
  key_type local_60;
  pool_allocator<char> local_38;
  
  iVar3 = strcmp("require",behaviorString);
  if (iVar3 != 0) {
    iVar3 = strcmp("enable",behaviorString);
    if (iVar3 != 0) goto LAB_00362a47;
  }
  local_38.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_60,
             extension,&local_38);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
                  *)&this->extensionMinSpv,&local_60);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->extensionMinSpv).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)*(uint *)&iVar4._M_node[2]._M_parent;
  }
  (*this->_vptr_TParseVersions[0x2c])(this,loc,extension,uVar5);
LAB_00362a47:
  if ((this->spvVersion).spv != 0) {
    pbVar6 = (this->spvUnsupportedExt).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->spvUnsupportedExt).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar1) {
      do {
        local_60._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_60,pcVar2,pcVar2 + pbVar6->_M_string_length);
        iVar3 = strcmp(extension,local_60._M_dataplus._M_p);
        if (iVar3 == 0) {
          (*this->_vptr_TParseVersions[0x2d])
                    (this,loc,"not allowed when using generating SPIR-V codes",extension,"");
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
    }
  }
  return;
}

Assistant:

void TParseVersions::extensionRequires(const TSourceLoc &loc, const char * const extension, const char *behaviorString)
{
    bool isEnabled = false;
    if (!strcmp("require", behaviorString))
        isEnabled = true;
    else if (!strcmp("enable", behaviorString))
        isEnabled = true;

    if (isEnabled) {
        unsigned int minSpvVersion = 0;
        auto iter = extensionMinSpv.find(TString(extension));
        if (iter != extensionMinSpv.end())
            minSpvVersion = iter->second;
        requireSpv(loc, extension, minSpvVersion);
    }

    if (spvVersion.spv != 0){
        for (auto ext : spvUnsupportedExt){
            if (strcmp(extension, ext.c_str()) == 0)
                error(loc, "not allowed when using generating SPIR-V codes", extension, "");
        }
    }
}